

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O0

void __thiscall
cmCursesOptionsWidget::cmCursesOptionsWidget
          (cmCursesOptionsWidget *this,int width,int height,int left,int top)

{
  bool bVar1;
  int top_local;
  int left_local;
  int height_local;
  int width_local;
  cmCursesOptionsWidget *this_local;
  
  cmCursesWidget::cmCursesWidget(&this->super_cmCursesWidget,width,height,left,top);
  (this->super_cmCursesWidget)._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesOptionsWidget_00f4a878;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Options);
  (this->super_cmCursesWidget).Type = BOOL;
  bVar1 = cmCursesColor::HasColors();
  if (bVar1) {
    set_field_fore((this->super_cmCursesWidget).Field,0x500);
    set_field_back((this->super_cmCursesWidget).Field,0x500);
  }
  else {
    set_field_fore((this->super_cmCursesWidget).Field,0);
    set_field_back((this->super_cmCursesWidget).Field,0x10000);
  }
  field_opts_off((this->super_cmCursesWidget).Field,0x200);
  return;
}

Assistant:

cmCursesOptionsWidget::cmCursesOptionsWidget(int width, int height, int left,
                                             int top)
  : cmCursesWidget(width, height, left, top)
{
  this->Type = cmStateEnums::BOOL; // this is a bit of a hack
  // there is no option type, and string type causes ccmake to cast
  // the widget into a string widget at some point.  BOOL is safe for
  // now.
  if (cmCursesColor::HasColors()) {
    set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::Choice));
    set_field_back(this->Field, COLOR_PAIR(cmCursesColor::Choice));
  } else {
    set_field_fore(this->Field, A_NORMAL);
    set_field_back(this->Field, A_STANDOUT);
  }
  field_opts_off(this->Field, O_STATIC);
}